

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void tlb_set_dirty_sparc64(CPUState *cpu,target_ulong vaddr)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  pvVar1 = cpu->env_ptr;
  uVar2 = vaddr & 0xffffffffffffe000;
  lVar4 = -0x70;
  do {
    lVar3 = *(long *)((long)pvVar1 + lVar4 + 8);
    lVar5 = (*(ulong *)((long)pvVar1 + lVar4) >> 6 & vaddr >> 0xd) * 0x40;
    if (*(long *)(lVar3 + 8 + lVar5) == uVar2 + 0x800) {
      *(ulong *)(lVar5 + lVar3 + 8) = uVar2;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != -0x10);
  lVar4 = (long)pvVar1 + -0x1088;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      if (*(ulong *)(lVar4 + lVar5) == (uVar2 | 0x800)) {
        *(ulong *)(lVar4 + lVar5) = uVar2;
      }
      lVar5 = lVar5 + 0x40;
    } while (lVar5 != 0x200);
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x2b8;
  } while (lVar3 != 6);
  return;
}

Assistant:

void tlb_set_dirty(CPUState *cpu, target_ulong vaddr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    CPUArchState *env = cpu->env_ptr;
    int mmu_idx;

    // assert_cpu_is_self(cpu);

    vaddr &= TARGET_PAGE_MASK;
    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        tlb_set_dirty1_locked(tlb_entry(env, mmu_idx, vaddr), vaddr);
    }

    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        int k;
        for (k = 0; k < CPU_VTLB_SIZE; k++) {
            tlb_set_dirty1_locked(&env_tlb(env)->d[mmu_idx].vtable[k], vaddr);
        }
    }
}